

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_impl.h
# Opt level: O2

void secp256k1_ecmult(secp256k1_ecmult_context *ctx,secp256k1_gej *r,secp256k1_gej *a,
                     secp256k1_scalar *na,secp256k1_scalar *ng)

{
  secp256k1_strauss_state state;
  secp256k1_fe zr [8];
  secp256k1_ge pre_a [8];
  secp256k1_gej prej [8];
  secp256k1_strauss_point_state ps [1];
  
  state.prej = prej;
  state.zr = zr;
  state.pre_a = pre_a;
  state.ps = ps;
  secp256k1_ecmult_strauss_wnaf(ctx,&state,r,1,a,na,ng);
  return;
}

Assistant:

static void secp256k1_ecmult(const secp256k1_ecmult_context *ctx, secp256k1_gej *r, const secp256k1_gej *a, const secp256k1_scalar *na, const secp256k1_scalar *ng) {
    secp256k1_gej prej[ECMULT_TABLE_SIZE(WINDOW_A)];
    secp256k1_fe zr[ECMULT_TABLE_SIZE(WINDOW_A)];
    secp256k1_ge pre_a[ECMULT_TABLE_SIZE(WINDOW_A)];
    struct secp256k1_strauss_point_state ps[1];
#ifdef USE_ENDOMORPHISM
    secp256k1_ge pre_a_lam[ECMULT_TABLE_SIZE(WINDOW_A)];
#endif
    struct secp256k1_strauss_state state;

    state.prej = prej;
    state.zr = zr;
    state.pre_a = pre_a;
#ifdef USE_ENDOMORPHISM
    state.pre_a_lam = pre_a_lam;
#endif
    state.ps = ps;
    secp256k1_ecmult_strauss_wnaf(ctx, &state, r, 1, a, na, ng);
}